

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O1

handle * __thiscall
gmlc::libguarded::shared_guarded_opt<int,std::shared_timed_mutex>::
try_lock_for<std::chrono::duration<long,std::ratio<1l,1000l>>>
          (handle *__return_storage_ptr__,void *this,
          duration<long,_std::ratio<1L,_1000L>_> *duration)

{
  char cVar1;
  duration<long,_std::ratio<1L,_1000L>_> *in_R8;
  unique_lock<std::shared_timed_mutex> local_20;
  
  cVar1 = *(char *)((long)this + 0x40);
  if (cVar1 == '\x01') {
    try_lock_handle_for<int,std::shared_timed_mutex,std::chrono::duration<long,std::ratio<1l,1000l>>>
              (__return_storage_ptr__,(libguarded *)this,(int *)((long)this + 8),
               (shared_timed_mutex *)duration,in_R8);
  }
  else {
    __return_storage_ptr__->data = (pointer)this;
    (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
    local_20._M_device = (mutex_type *)0x0;
    local_20._M_owns = false;
  }
  if (cVar1 == '\0') {
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::try_lock_for(const Duration& duration) -> handle
{
    return (enabled) ? try_lock_handle_for(&m_obj, m_mutex, duration) :
                       handle(&m_obj, std::unique_lock<M>{});
}